

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crypto.cpp
# Opt level: O1

void __thiscall bigint<13>::printdigits(bigint<13> *this,vector<char> *buf)

{
  ushort uVar1;
  byte bVar2;
  ushort uVar3;
  uint shift;
  int iVar4;
  byte *x;
  uint uVar5;
  byte local_3a;
  byte local_39;
  bigint<13> *local_38;
  
  iVar4 = this->len;
  if (0 < iVar4) {
    uVar5 = 0;
    local_38 = this;
    do {
      uVar1 = local_38->digits[(int)(~uVar5 + iVar4)];
      iVar4 = 0xc;
      do {
        uVar3 = uVar1 >> ((byte)iVar4 & 0x1f) & 0xf;
        bVar2 = (byte)uVar3;
        if (uVar3 < 10) {
          local_39 = bVar2 | 0x30;
          x = &local_39;
        }
        else {
          local_3a = bVar2 + 0x57;
          x = &local_3a;
        }
        vector<char>::add(buf,(char *)x);
        iVar4 = iVar4 + -4;
      } while (iVar4 != -4);
      uVar5 = uVar5 + 1;
      iVar4 = local_38->len;
    } while ((int)uVar5 < iVar4);
  }
  return;
}

Assistant:

void printdigits(vector<char> &buf) const
    {
        loopi(len)
        {
            digit d = digits[len-i-1];
            loopj(BI_DIGIT_BITS/4)
            {
                uint shift = BI_DIGIT_BITS - (j+1)*4;
                int val = (d >> shift) & 0xF;
                if(val < 10) buf.add('0' + val);
                else buf.add('a' + val - 10);
            }
        }
    }